

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O2

void __thiscall despot::BaseTag::CreateScenarioUpperBound(BaseTag *this)

{
  string *in_RDX;
  string *in_RSI;
  
  CreateScenarioUpperBound
            ((BaseTag *)
             &this[-1].memory_pool_.freelist_.
              super__Vector_base<despot::TagState_*,_std::allocator<despot::TagState_*>_>._M_impl.
              super__Vector_impl_data._M_finish,in_RSI,in_RDX);
  return;
}

Assistant:

ScenarioUpperBound* BaseTag::CreateScenarioUpperBound(string name,
	string particle_bound_name) const {
	if (name == "TRIVIAL" || name == "DEFAULT" || name == "MDP" ||
			name == "SP" || name == "MANHATTAN") {
		return CreateParticleUpperBound(name);
	} else if (name == "LOOKAHEAD") {
		return new LookaheadUpperBound(this, *this,
			CreateParticleUpperBound(particle_bound_name));
	} else {
		if (name != "print")
			cerr << "Unsupported upper bound: " << name << endl;
		cerr << "Supported types: TRIVIAL, MDP, SP, MANHATTAN, LOOKAHEAD (default to SP)" << endl;
		cerr << "With base upper bound: LOOKAHEAD" << endl;
		exit(1);
		return NULL;
	}
}